

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExtractEuler.cpp
# Opt level: O1

void anon_unknown.dwarf_5d914::testMatrix
               (M44f *M,_func_M44f_M44f_ptr_Order *matrixEulerMatrix,Order order)

{
  ostream *poVar1;
  long lVar2;
  Matrix44<float> *pMVar3;
  long lVar4;
  M44f N;
  Matrix44<float> local_a8;
  M44f local_68;
  
  pMVar3 = &local_a8;
  (*matrixEulerMatrix)(&local_68,M,order);
  local_a8.x[0][0] = M->x[0][0] - local_68.x[0][0];
  local_a8.x[0][1] = M->x[0][1] - local_68.x[0][1];
  local_a8.x[0][2] = M->x[0][2] - local_68.x[0][2];
  local_a8.x[0][3] = M->x[0][3] - local_68.x[0][3];
  local_a8.x[1][0] = M->x[1][0] - local_68.x[1][0];
  local_a8.x[1][1] = M->x[1][1] - local_68.x[1][1];
  local_a8.x[1][2] = M->x[1][2] - local_68.x[1][2];
  local_a8.x[1][3] = M->x[1][3] - local_68.x[1][3];
  local_a8.x[2][0] = M->x[2][0] - local_68.x[2][0];
  local_a8.x[2][1] = M->x[2][1] - local_68.x[2][1];
  local_a8.x[2][2] = M->x[2][2] - local_68.x[2][2];
  local_a8.x[2][3] = M->x[2][3] - local_68.x[2][3];
  local_a8.x[3][0] = M->x[3][0] - local_68.x[3][0];
  local_a8.x[3][1] = M->x[3][1] - local_68.x[3][1];
  local_a8.x[3][2] = M->x[3][2] - local_68.x[3][2];
  local_a8.x[3][3] = M->x[3][3] - local_68.x[3][3];
  lVar4 = 0;
  do {
    lVar2 = 0;
    do {
      if (2e-06 < ABS(*(float *)((long)pMVar3 + lVar2 * 4))) {
        poVar1 = std::operator<<((ostream *)&std::cout,
                                 "unexpectedly large matrix to euler angles conversion error: ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(float *)((long)pMVar3 + lVar2 * 4));
        std::endl<char,std::char_traits<char>>(poVar1);
        poVar1 = (ostream *)std::ostream::operator<<(&std::cout,(int)lVar4);
        poVar1 = std::operator<<(poVar1," ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)lVar2);
        std::endl<char,std::char_traits<char>>(poVar1);
        poVar1 = std::operator<<((ostream *)&std::cout,"M\n");
        poVar1 = Imath_3_2::operator<<(poVar1,M);
        std::endl<char,std::char_traits<char>>(poVar1);
        poVar1 = std::operator<<((ostream *)&std::cout,"N\n");
        poVar1 = Imath_3_2::operator<<(poVar1,&local_68);
        std::endl<char,std::char_traits<char>>(poVar1);
        poVar1 = std::operator<<((ostream *)&std::cout,"D\n");
        poVar1 = Imath_3_2::operator<<(poVar1,&local_a8);
        std::endl<char,std::char_traits<char>>(poVar1);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testExtractEuler.cpp"
                      ,0x57,
                      "void (anonymous namespace)::testMatrix(const M44f, M44f (*)(const M44f &, Eulerf::Order), Eulerf::Order)"
                     );
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
    lVar4 = lVar4 + 1;
    pMVar3 = (Matrix44<float> *)((long)pMVar3 + 0x10);
  } while (lVar4 != 3);
  return;
}

Assistant:

void
testMatrix (
    const M44f M,
    M44f (*matrixEulerMatrix) (const M44f&, Eulerf::Order),
    Eulerf::Order order)
{
    //
    // Extract Euler angles from M, and convert the
    // Euler angles back to a matrix, N.
    //

    M44f N = matrixEulerMatrix (M, order);

    //
    // Verify that the entries in M and N do not
    // differ too much.
    //

    M44f D (M - N);

    for (int j = 0; j < 3; ++j)
    {
        for (int k = 0; k < 3; ++k)
        {
            if (abs (D[j][k]) > 0.000002)
            {
                cout << "unexpectedly large matrix to "
                        "euler angles conversion error: "
                     << D[j][k] << endl;

                cout << j << " " << k << endl;

                cout << "M\n" << M << endl;
                cout << "N\n" << N << endl;
                cout << "D\n" << D << endl;

                assert (false);
            }
        }
    }
}